

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  string *psVar1;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  local_50.View_._M_str = (psVar1->_M_dataplus)._M_p;
  local_50.View_._M_len = psVar1->_M_string_length;
  local_80.View_._M_len = 0xc;
  local_80.View_._M_str = "/CMakeFiles/";
  psVar1 = GetName_abi_cxx11_(this);
  cmStrCat<std::__cxx11::string>(__return_storage_ptr__,&local_50,&local_80,psVar1);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetSupportDirectory() const
{
  std::string dir = cmStrCat(this->LocalGenerator->GetCurrentBinaryDirectory(),
                             "/CMakeFiles/", this->GetName());
#if defined(__VMS)
  dir += "_dir";
#else
  dir += ".dir";
#endif
  return dir;
}